

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000256f80 = 0x2d2d2d2d2d2d2d;
    uRam0000000000256f87._0_1_ = '-';
    uRam0000000000256f87._1_1_ = '-';
    uRam0000000000256f87._2_1_ = '-';
    uRam0000000000256f87._3_1_ = '-';
    uRam0000000000256f87._4_1_ = '-';
    uRam0000000000256f87._5_1_ = '-';
    uRam0000000000256f87._6_1_ = '-';
    uRam0000000000256f87._7_1_ = '-';
    DAT_00256f70 = '-';
    DAT_00256f70_1._0_1_ = '-';
    DAT_00256f70_1._1_1_ = '-';
    DAT_00256f70_1._2_1_ = '-';
    DAT_00256f70_1._3_1_ = '-';
    DAT_00256f70_1._4_1_ = '-';
    DAT_00256f70_1._5_1_ = '-';
    DAT_00256f70_1._6_1_ = '-';
    uRam0000000000256f78 = 0x2d2d2d2d2d2d2d;
    DAT_00256f7f = 0x2d;
    DAT_00256f60 = '-';
    DAT_00256f60_1._0_1_ = '-';
    DAT_00256f60_1._1_1_ = '-';
    DAT_00256f60_1._2_1_ = '-';
    DAT_00256f60_1._3_1_ = '-';
    DAT_00256f60_1._4_1_ = '-';
    DAT_00256f60_1._5_1_ = '-';
    DAT_00256f60_1._6_1_ = '-';
    uRam0000000000256f68._0_1_ = '-';
    uRam0000000000256f68._1_1_ = '-';
    uRam0000000000256f68._2_1_ = '-';
    uRam0000000000256f68._3_1_ = '-';
    uRam0000000000256f68._4_1_ = '-';
    uRam0000000000256f68._5_1_ = '-';
    uRam0000000000256f68._6_1_ = '-';
    uRam0000000000256f68._7_1_ = '-';
    DAT_00256f50 = '-';
    DAT_00256f50_1._0_1_ = '-';
    DAT_00256f50_1._1_1_ = '-';
    DAT_00256f50_1._2_1_ = '-';
    DAT_00256f50_1._3_1_ = '-';
    DAT_00256f50_1._4_1_ = '-';
    DAT_00256f50_1._5_1_ = '-';
    DAT_00256f50_1._6_1_ = '-';
    uRam0000000000256f58._0_1_ = '-';
    uRam0000000000256f58._1_1_ = '-';
    uRam0000000000256f58._2_1_ = '-';
    uRam0000000000256f58._3_1_ = '-';
    uRam0000000000256f58._4_1_ = '-';
    uRam0000000000256f58._5_1_ = '-';
    uRam0000000000256f58._6_1_ = '-';
    uRam0000000000256f58._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000256f48._0_1_ = '-';
    uRam0000000000256f48._1_1_ = '-';
    uRam0000000000256f48._2_1_ = '-';
    uRam0000000000256f48._3_1_ = '-';
    uRam0000000000256f48._4_1_ = '-';
    uRam0000000000256f48._5_1_ = '-';
    uRam0000000000256f48._6_1_ = '-';
    uRam0000000000256f48._7_1_ = '-';
    DAT_00256f8f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}